

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::lossToString_abi_cxx11_(Args *this,loss_name ln)

{
  int in_EDX;
  string *in_RDI;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  if (in_EDX == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"hs",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_EDX == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"ns",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_EDX == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"softmax",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Unknown loss!",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  return in_RDI;
}

Assistant:

std::string Args::lossToString(loss_name ln) const {
  switch (ln) {
    case loss_name::hs:
      return "hs";
    case loss_name::ns:
      return "ns";
    case loss_name::softmax:
      return "softmax";
  }
  return "Unknown loss!"; // should never happen
}